

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

UniformCollection *
deqp::gles3::Functional::anon_unknown_1::UniformCollection::nestedArraysStructs
          (DataType type0,DataType type1,char *nameSuffix)

{
  bool bVar1;
  UniformCollection *pUVar2;
  StructType *pSVar3;
  char *pcVar4;
  VarType local_2b0;
  allocator<char> local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  Uniform local_250;
  VarType local_218;
  VarType local_200;
  VarType local_1e8;
  VarType local_1d0;
  VarType local_1b8;
  VarType local_1a0;
  VarType local_188;
  VarType local_170;
  VarType local_158;
  VarType local_140;
  undefined1 local_122;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  StructType *local_e0;
  StructType *subSubStructType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  StructType *local_90;
  StructType *subStructType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  StructType *local_40;
  StructType *structType;
  Precision local_30;
  Precision prec1;
  Precision prec0;
  UniformCollection *local_20;
  UniformCollection *res;
  char *nameSuffix_local;
  DataType type1_local;
  DataType type0_local;
  
  res = (UniformCollection *)nameSuffix;
  nameSuffix_local._0_4_ = type1;
  nameSuffix_local._4_4_ = type0;
  pUVar2 = (UniformCollection *)operator_new(0x30);
  UniformCollection(pUVar2);
  local_20 = pUVar2;
  bVar1 = glu::isDataTypeBoolOrBVec(nameSuffix_local._4_4_);
  local_30 = bVar1 + 1 + (uint)bVar1;
  bVar1 = glu::isDataTypeBoolOrBVec((DataType)nameSuffix_local);
  structType._4_4_ = bVar1 + 1 + (uint)bVar1;
  pSVar3 = (StructType *)operator_new(0x38);
  subStructType._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"structType",(allocator<char> *)((long)&subStructType + 7));
  std::operator+(&local_60,&local_80,(char *)res);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  glu::StructType::StructType(pSVar3,pcVar4);
  subStructType._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&subStructType + 7));
  local_40 = pSVar3;
  pSVar3 = (StructType *)operator_new(0x38);
  subSubStructType._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"subStructType",(allocator<char> *)((long)&subSubStructType + 7));
  std::operator+(&local_b0,&local_d0,(char *)res);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  glu::StructType::StructType(pSVar3,pcVar4);
  subSubStructType._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&subSubStructType + 7));
  local_90 = pSVar3;
  pSVar3 = (StructType *)operator_new(0x38);
  local_122 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"subSubStructType",&local_121);
  std::operator+(&local_100,&local_120,(char *)res);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  glu::StructType::StructType(pSVar3,pcVar4);
  local_122 = 0;
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  local_e0 = pSVar3;
  glu::VarType::VarType(&local_140,nameSuffix_local._4_4_,local_30);
  glu::StructType::addMember(pSVar3,"mss0",&local_140);
  glu::VarType::~VarType(&local_140);
  pSVar3 = local_e0;
  glu::VarType::VarType(&local_158,(DataType)nameSuffix_local,structType._4_4_);
  glu::StructType::addMember(pSVar3,"mss1",&local_158);
  glu::VarType::~VarType(&local_158);
  pSVar3 = local_90;
  glu::VarType::VarType(&local_170,(DataType)nameSuffix_local,structType._4_4_);
  glu::StructType::addMember(pSVar3,"ms0",&local_170);
  glu::VarType::~VarType(&local_170);
  pSVar3 = local_90;
  glu::VarType::VarType(&local_1a0,nameSuffix_local._4_4_,local_30);
  glu::VarType::VarType(&local_188,&local_1a0,2);
  glu::StructType::addMember(pSVar3,"ms1",&local_188);
  glu::VarType::~VarType(&local_188);
  glu::VarType::~VarType(&local_1a0);
  pSVar3 = local_90;
  glu::VarType::VarType(&local_1d0,local_e0);
  glu::VarType::VarType(&local_1b8,&local_1d0,2);
  glu::StructType::addMember(pSVar3,"ms2",&local_1b8);
  glu::VarType::~VarType(&local_1b8);
  glu::VarType::~VarType(&local_1d0);
  pSVar3 = local_40;
  glu::VarType::VarType(&local_1e8,nameSuffix_local._4_4_,local_30);
  glu::StructType::addMember(pSVar3,"m0",&local_1e8);
  glu::VarType::~VarType(&local_1e8);
  pSVar3 = local_40;
  glu::VarType::VarType(&local_200,local_90);
  glu::StructType::addMember(pSVar3,"m1",&local_200);
  glu::VarType::~VarType(&local_200);
  pSVar3 = local_40;
  glu::VarType::VarType(&local_218,(DataType)nameSuffix_local,structType._4_4_);
  glu::StructType::addMember(pSVar3,"m2",&local_218);
  glu::VarType::~VarType(&local_218);
  addStructType(local_20,local_e0);
  addStructType(local_20,local_90);
  addStructType(local_20,local_40);
  pUVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"u_var",&local_291);
  std::operator+(&local_270,&local_290,(char *)res);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  glu::VarType::VarType(&local_2b0,local_40);
  anon_unknown_1::Uniform::Uniform(&local_250,pcVar4,&local_2b0);
  addUniform(pUVar2,&local_250);
  anon_unknown_1::Uniform::~Uniform(&local_250);
  glu::VarType::~VarType(&local_2b0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  return local_20;
}

Assistant:

static UniformCollection* nestedArraysStructs (const glu::DataType type0, const glu::DataType type1, const char* const nameSuffix = "")
	{
		UniformCollection* const res		= new UniformCollection;
		const glu::Precision prec0			= glu::isDataTypeBoolOrBVec(type0) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;
		const glu::Precision prec1			= glu::isDataTypeBoolOrBVec(type1) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;
		StructType* const structType		= new StructType((string("structType") + nameSuffix).c_str());
		StructType* const subStructType		= new StructType((string("subStructType") + nameSuffix).c_str());
		StructType* const subSubStructType	= new StructType((string("subSubStructType") + nameSuffix).c_str());

		subSubStructType->addMember("mss0", glu::VarType(type0, prec0));
		subSubStructType->addMember("mss1", glu::VarType(type1, prec1));

		subStructType->addMember("ms0", glu::VarType(type1, prec1));
		subStructType->addMember("ms1", glu::VarType(glu::VarType(type0, prec0), 2));
		subStructType->addMember("ms2", glu::VarType(glu::VarType(subSubStructType), 2));

		structType->addMember("m0", glu::VarType(type0, prec0));
		structType->addMember("m1", glu::VarType(subStructType));
		structType->addMember("m2", glu::VarType(type1, prec1));

		res->addStructType(subSubStructType);
		res->addStructType(subStructType);
		res->addStructType(structType);

		res->addUniform(Uniform((string("u_var") + nameSuffix).c_str(), glu::VarType(structType)));

		return res;
	}